

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var Js::TypedArrayBase::GetKeysEntriesValuesHelper
              (Arguments *args,ScriptContext *scriptContext,LPCWSTR apiName,
              JavascriptArrayIteratorKind kind)

{
  JavascriptLibrary *pJVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  PropertyId propertyId;
  BOOL BVar5;
  TypedArrayBase *iterable;
  JavascriptString *propertyName;
  Var pvVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  JavascriptMethod entryPoint;
  JavascriptArrayIterator *pJVar8;
  Arguments local_68;
  Var local_58;
  Var argsIt [3];
  
  iterable = ValidateTypedArray(args,scriptContext,apiName);
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  bVar4 = ScriptContext::IsJsBuiltInEnabled(scriptContext);
  if (!bVar4) {
    pJVar8 = JavascriptLibrary::CreateArrayIterator
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,iterable,kind);
    return pJVar8;
  }
  propertyName = JavascriptString::NewWithSz(L"CreateArrayIterator",scriptContext);
  propertyId = JavascriptOperators::GetPropertyId(propertyName,scriptContext);
  pvVar6 = JavascriptOperators::OP_GetProperty
                     ((pJVar1->chakraLibraryObject).ptr,propertyId,scriptContext);
  BVar5 = JavascriptOperators::IsUndefinedOrNull(pvVar6);
  if (BVar5 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x658,"(!JavascriptOperators::IsUndefinedOrNull(scriptFunction))",
                                "!JavascriptOperators::IsUndefinedOrNull(scriptFunction)");
    if (!bVar4) goto LAB_00d6b2aa;
    *puVar7 = 0;
  }
  bVar4 = JavascriptConversion::IsCallable(pvVar6);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x659,"(JavascriptConversion::IsCallable(scriptFunction))",
                                "JavascriptConversion::IsCallable(scriptFunction)");
    if (!bVar4) {
LAB_00d6b2aa:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  this = VarTo<Js::RecyclableObject>(pvVar6);
  local_58 = JavascriptOperators::OP_GetProperty
                       ((pJVar1->super_JavascriptLibraryBase).globalObject.ptr,0x27a,scriptContext);
  argsIt[0] = Arguments::operator[](args,0);
  argsIt[1] = (Var)((ulong)kind | 0x1000000000000);
  pTVar2 = scriptContext->threadContext;
  bVar4 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  entryPoint = RecyclableObject::GetEntryPoint(this);
  local_68.Info = (Type)0x2000003;
  local_68.Values = &local_58;
  pvVar6 = JavascriptFunction::CallFunction<true>(this,entryPoint,&local_68,false);
  pTVar2->reentrancySafeOrHandled = bVar4;
  return pvVar6;
}

Assistant:

Var TypedArrayBase::GetKeysEntriesValuesHelper(Arguments& args, ScriptContext *scriptContext, LPCWSTR apiName, JavascriptArrayIteratorKind kind)
    {
        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, apiName);
#ifdef ENABLE_JS_BUILTINS
        JavascriptLibrary * library = scriptContext->GetLibrary();
        if (scriptContext->IsJsBuiltInEnabled())
        {
            JavascriptString* methodName = JavascriptString::NewWithSz(_u("CreateArrayIterator"), scriptContext);
            PropertyIds functionIdentifier = JavascriptOperators::GetPropertyId(methodName, scriptContext);
            Var scriptFunction = JavascriptOperators::OP_GetProperty(library->GetChakraLib(), functionIdentifier, scriptContext);

            Assert(!JavascriptOperators::IsUndefinedOrNull(scriptFunction));
            Assert(JavascriptConversion::IsCallable(scriptFunction));

            RecyclableObject* function = VarTo<RecyclableObject>(scriptFunction);

            Var chakraLibObj = JavascriptOperators::OP_GetProperty(library->GetGlobalObject(), PropertyIds::__chakraLibrary, scriptContext);
            Var argsIt[] = { chakraLibObj, args[0], TaggedInt::ToVarUnchecked((int)kind) };
            CallInfo callInfo(CallFlags_Value, 3);
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                return JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), Js::Arguments(callInfo, argsIt));
            }
            END_SAFE_REENTRANT_CALL
        }
        else
#endif
        return scriptContext->GetLibrary()->CreateArrayIterator(typedArrayBase, kind);
    }